

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

objdef * objexp(mcmcxdef *ctx,objnum obj,ushort *siz)

{
  short sVar1;
  uchar *puVar2;
  short *in_RDX;
  ushort in_SI;
  undefined8 *in_RDI;
  uchar *p;
  ushort oldsiz;
  ushort in_stack_0000017c;
  mcmon in_stack_0000017e;
  mcmcxdef *in_stack_00000180;
  
  sVar1 = *(short *)(*(long *)(*(long *)*in_RDI +
                              (long)((int)(uint)*(ushort *)
                                                 (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                                 (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
                     (long)(int)(*(ushort *)
                                  (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                  (long)(int)(in_SI & 0xff) * 2) & 0xff) * 0x20 + 0x18);
  puVar2 = mcmrealo(in_stack_00000180,in_stack_0000017e,in_stack_0000017c);
  *in_RDX = *(short *)(*(long *)(*(long *)*in_RDI +
                                (long)((int)(uint)*(ushort *)
                                                   (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                                   (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
                       (long)(int)(*(ushort *)
                                    (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                    (long)(int)(in_SI & 0xff) * 2) & 0xff) * 0x20 + 0x18) - sVar1;
  return puVar2;
}

Assistant:

objdef *objexp(mcmcxdef *ctx, objnum obj, ushort *siz)
{
    ushort  oldsiz;
    uchar  *p;
    
    oldsiz = mcmobjsiz(ctx, (mcmon)obj);
    p = mcmrealo(ctx, (mcmon)obj, (ushort)(oldsiz + *siz));
    *siz = mcmobjsiz(ctx, (mcmon)obj) - oldsiz;
    return((objdef *)p);
}